

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_quadratic_model.hpp
# Opt level: O3

void __thiscall
cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense>::flip_variable
          (BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense> *this,uint *v)

{
  double *pdVar1;
  double *pdVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  undefined4 uVar7;
  uint uVar8;
  ulong in_RAX;
  iterator iVar9;
  double *pdVar10;
  Index size;
  char *pcVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  undefined8 local_18;
  
  if (this->m_vartype == BINARY) {
    local_18 = in_RAX & 0xffffffff;
    change_vartype(this,(Vartype *)((long)&local_18 + 4));
    iVar9 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->_label_to_idx)._M_h,v);
    if (iVar9.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_long>,_false>._M_cur
        == (__node_type *)0x0) goto LAB_001865eb;
    pdVar10 = (this->_quadmat).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    uVar3 = (this->_quadmat).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
            m_storage.m_cols;
    if ((long)uVar3 < 0 && pdVar10 != (double *)0x0) goto LAB_001865f7;
    lVar4 = *(long *)((long)iVar9.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_long>,_false>
                            ._M_cur + 0x10);
    if ((lVar4 < 0) ||
       ((this->_quadmat).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
        m_rows <= lVar4)) goto LAB_0018660e;
    if ((long)uVar3 < 0) goto LAB_00186625;
    pdVar10 = pdVar10 + uVar3 * lVar4;
    uVar12 = uVar3;
    if ((((ulong)pdVar10 & 7) == 0) &&
       (uVar12 = (ulong)((uint)((ulong)pdVar10 >> 3) & 1), uVar3 <= uVar12)) {
      uVar12 = uVar3;
    }
    lVar13 = uVar3 - uVar12;
    if (uVar12 != 0) {
      uVar14 = 0;
      do {
        pdVar10[uVar14] = -pdVar10[uVar14];
        uVar14 = uVar14 + 1;
      } while (uVar12 != uVar14);
    }
    uVar14 = (lVar13 - (lVar13 >> 0x3f) & 0xfffffffffffffffeU) + uVar12;
    if (1 < lVar13) {
      do {
        pdVar1 = pdVar10 + uVar12;
        uVar6 = *(uint *)((long)pdVar1 + 4);
        uVar7 = *(undefined4 *)(pdVar1 + 1);
        uVar8 = *(uint *)((long)pdVar1 + 0xc);
        pdVar2 = pdVar10 + uVar12;
        *(undefined4 *)pdVar2 = *(undefined4 *)pdVar1;
        *(uint *)((long)pdVar2 + 4) = uVar6 ^ 0x80000000;
        *(undefined4 *)(pdVar2 + 1) = uVar7;
        *(uint *)((long)pdVar2 + 0xc) = uVar8 ^ 0x80000000;
        uVar12 = uVar12 + 2;
      } while ((long)uVar12 < (long)uVar14);
    }
    if ((long)uVar14 < (long)uVar3) {
      do {
        pdVar10[uVar14] = -pdVar10[uVar14];
        uVar14 = uVar14 + 1;
      } while (uVar3 != uVar14);
    }
    pdVar10 = (this->_quadmat).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    lVar13 = (this->_quadmat).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
             m_storage.m_rows;
    if (lVar13 < 0 && pdVar10 != (double *)0x0) goto LAB_0018663c;
    lVar5 = (this->_quadmat).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
            m_storage.m_cols;
    if (lVar5 <= lVar4) goto LAB_0018665b;
    if (-1 < lVar13) {
      if (lVar13 != 0) {
        pdVar10 = pdVar10 + lVar4;
        do {
          *pdVar10 = -*pdVar10;
          pdVar10 = pdVar10 + lVar5;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      local_18 = CONCAT44(local_18._4_4_,1);
      change_vartype(this,(Vartype *)&local_18);
      return;
    }
  }
  else {
    if (this->m_vartype != SPIN) {
      return;
    }
    local_18 = in_RAX;
    iVar9 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->_label_to_idx)._M_h,v);
    if (iVar9.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_long>,_false>._M_cur
        == (__node_type *)0x0) {
LAB_001865eb:
      std::__throw_out_of_range("_Map_base::at");
    }
    pdVar10 = (this->_quadmat).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    uVar3 = (this->_quadmat).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
            m_storage.m_cols;
    if ((long)uVar3 < 0 && pdVar10 != (double *)0x0) {
LAB_001865f7:
      pcVar11 = 
      "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>, Level = 0]"
      ;
LAB_00186651:
      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                    ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,pcVar11);
    }
    lVar4 = *(long *)((long)iVar9.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_long>,_false>
                            ._M_cur + 0x10);
    if ((lVar4 < 0) ||
       ((this->_quadmat).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
        m_rows <= lVar4)) {
LAB_0018660e:
      pcVar11 = 
      "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 1, BlockCols = -1, InnerPanel = true]"
      ;
LAB_00186670:
      __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,pcVar11);
    }
    if ((long)uVar3 < 0) {
LAB_00186625:
      pcVar11 = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, 1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, 1, -1>]"
      ;
      goto LAB_0018668f;
    }
    pdVar10 = pdVar10 + uVar3 * lVar4;
    uVar12 = uVar3;
    if ((((ulong)pdVar10 & 7) == 0) &&
       (uVar12 = (ulong)((uint)((ulong)pdVar10 >> 3) & 1), uVar3 <= uVar12)) {
      uVar12 = uVar3;
    }
    lVar13 = uVar3 - uVar12;
    if (uVar12 != 0) {
      uVar14 = 0;
      do {
        pdVar10[uVar14] = -pdVar10[uVar14];
        uVar14 = uVar14 + 1;
      } while (uVar12 != uVar14);
    }
    uVar14 = (lVar13 - (lVar13 >> 0x3f) & 0xfffffffffffffffeU) + uVar12;
    if (1 < lVar13) {
      do {
        pdVar1 = pdVar10 + uVar12;
        uVar6 = *(uint *)((long)pdVar1 + 4);
        uVar7 = *(undefined4 *)(pdVar1 + 1);
        uVar8 = *(uint *)((long)pdVar1 + 0xc);
        pdVar2 = pdVar10 + uVar12;
        *(undefined4 *)pdVar2 = *(undefined4 *)pdVar1;
        *(uint *)((long)pdVar2 + 4) = uVar6 ^ 0x80000000;
        *(undefined4 *)(pdVar2 + 1) = uVar7;
        *(uint *)((long)pdVar2 + 0xc) = uVar8 ^ 0x80000000;
        uVar12 = uVar12 + 2;
      } while ((long)uVar12 < (long)uVar14);
    }
    if ((long)uVar14 < (long)uVar3) {
      do {
        pdVar10[uVar14] = -pdVar10[uVar14];
        uVar14 = uVar14 + 1;
      } while (uVar3 != uVar14);
    }
    pdVar10 = (this->_quadmat).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    lVar13 = (this->_quadmat).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
             m_storage.m_rows;
    if (lVar13 < 0 && pdVar10 != (double *)0x0) {
LAB_0018663c:
      pcVar11 = 
      "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, Level = 0]"
      ;
      goto LAB_00186651;
    }
    lVar5 = (this->_quadmat).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
            m_storage.m_cols;
    if (lVar5 <= lVar4) {
LAB_0018665b:
      pcVar11 = 
      "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
      ;
      goto LAB_00186670;
    }
    if (-1 < lVar13) {
      if (lVar13 == 0) {
        return;
      }
      pdVar10 = pdVar10 + lVar4;
      do {
        *pdVar10 = -*pdVar10;
        pdVar10 = pdVar10 + lVar5;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
      return;
    }
  }
  pcVar11 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
  ;
LAB_0018668f:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar11);
}

Assistant:

void flip_variable( const IndexType &v ) {

      if ( m_vartype == Vartype::SPIN ) {
        size_t i = _label_to_idx.at( v );
        _quadmat.row( i ) *= -1;
        _quadmat.col( i ) *= -1;
      } else if ( m_vartype == Vartype::BINARY ) {
        // change vartype to spin
        this->change_vartype( Vartype::SPIN );

        size_t i = _label_to_idx.at( v );
        _quadmat.row( i ) *= -1;
        _quadmat.col( i ) *= -1;

        // change vartype to binary
        this->change_vartype( Vartype::BINARY );
      }
    }